

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O0

void __thiscall QPDFParser::warnDuplicateKey(QPDFParser *this)

{
  qpdf_offset_t offset;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  QPDFParser *local_10;
  QPDFParser *this_local;
  
  local_10 = this;
  QTC::TC("qpdf","QPDFParser duplicate dict key",0);
  offset = this->frame->offset;
  std::operator+(&local_50,"dictionary has duplicated key ",&this->frame->key);
  std::operator+(&local_30,&local_50,"; last occurrence overrides earlier ones");
  warn(this,offset,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void
QPDFParser::warnDuplicateKey()
{
    QTC::TC("qpdf", "QPDFParser duplicate dict key");
    warn(
        frame->offset,
        "dictionary has duplicated key " + frame->key + "; last occurrence overrides earlier ones");
}